

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O3

jtokentype getJsonToken(string *tokenVal,uint *consumed,char *raw,char *end)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  jtokentype jVar6;
  uint codepoint_;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  char *__s1;
  long in_FS_OFFSET;
  JSONUTF8StringFilter writer;
  string numStr;
  JSONUTF8StringFilter local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tokenVal->_M_string_length = 0;
  *(tokenVal->_M_dataplus)._M_p = '\0';
  *consumed = 0;
  if (raw < end) {
    lVar9 = 0;
    jVar6 = JTOK_ERR;
    do {
      bVar2 = raw[lVar9];
      if (0x1f < bVar2) {
        iVar4 = (int)lVar9;
        if (0x5a < bVar2) {
          if (bVar2 < 0x6e) {
            if (bVar2 == 0x5b) {
              *consumed = iVar4 + 1;
              jVar6 = JTOK_ARR_OPEN;
              goto switchD_004896b3_caseD_21;
            }
            if (bVar2 == 0x5d) {
              *consumed = iVar4 + 1;
              jVar6 = JTOK_ARR_CLOSE;
              goto switchD_004896b3_caseD_21;
            }
            if (bVar2 != 0x66) goto switchD_004896b3_caseD_21;
          }
          else {
            if (0x7a < bVar2) {
              if (bVar2 == 0x7b) {
                *consumed = iVar4 + 1;
                jVar6 = JTOK_OBJ_OPEN;
              }
              else if (bVar2 == 0x7d) {
                *consumed = iVar4 + 1;
                jVar6 = JTOK_OBJ_CLOSE;
              }
              goto switchD_004896b3_caseD_21;
            }
            if ((bVar2 != 0x6e) && (bVar2 != 0x74)) goto switchD_004896b3_caseD_21;
          }
          __s1 = raw + lVar9;
          iVar3 = strncmp(__s1,"null",4);
          if (iVar3 == 0) {
            *consumed = iVar4 + 4;
            jVar6 = JTOK_KW_NULL;
          }
          else {
            iVar3 = strncmp(__s1,"true",4);
            if (iVar3 == 0) {
              *consumed = iVar4 + 4;
              jVar6 = JTOK_KW_TRUE;
            }
            else {
              iVar3 = strncmp(__s1,"false",5);
              if (iVar3 == 0) {
                *consumed = iVar4 + 5;
                jVar6 = JTOK_KW_FALSE;
              }
            }
          }
          goto switchD_004896b3_caseD_21;
        }
        switch(bVar2) {
        case 0x20:
          goto switchD_004896b3_caseD_20;
        default:
          goto switchD_004896b3_caseD_21;
        case 0x22:
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          local_70.str = &local_58;
          local_70.is_valid = true;
          local_70.codepoint = 0;
          local_70.state = 0;
          local_70.surpair = 0;
          jVar6 = JTOK_ERR;
          if (end <= raw + lVar9 + 1) goto switchD_004899ab_caseD_6f;
          pbVar7 = (byte *)(raw + lVar9 + 1);
          pbVar8 = (byte *)(raw + lVar9);
          goto LAB_00489931;
        case 0x2c:
          *consumed = iVar4 + 1;
          jVar6 = JTOK_COMMA;
          goto switchD_004896b3_caseD_21;
        case 0x2d:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          pbVar7 = (byte *)(raw + lVar9 + 1);
          pbVar8 = pbVar7;
          if (bVar2 - 0x30 < 10) {
            pbVar8 = (byte *)(raw + lVar9);
          }
          if (((*pbVar8 == 0x30) && (jVar6 = JTOK_ERR, (int)(char)pbVar8[1] - 0x30U < 10)) ||
             ((std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               push_back(&local_58,bVar2), pbVar7 < end && raw[lVar9] == 0x2d &&
              (jVar6 = JTOK_ERR, 9 < (int)(char)*pbVar7 - 0x30U)))) goto switchD_004899ab_caseD_6f;
          if (end <= pbVar7) goto LAB_00489aa7;
          pbVar8 = (byte *)(raw + lVar9 + 2);
          goto LAB_00489778;
        case 0x3a:
          *consumed = iVar4 + 1;
          jVar6 = JTOK_COLON;
          goto switchD_004896b3_caseD_21;
        }
      }
      if ((1 < bVar2 - 9) && (bVar2 != 0xd)) goto switchD_004896b3_caseD_21;
switchD_004896b3_caseD_20:
      lVar1 = lVar9 + 1;
      lVar9 = lVar9 + 1;
    } while (raw + lVar1 != end);
  }
  jVar6 = JTOK_NONE;
  goto switchD_004896b3_caseD_21;
  while( true ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_58,bVar2);
    pbVar8 = pbVar7 + 1;
    if (end <= pbVar7) break;
LAB_00489778:
    pbVar7 = pbVar8;
    bVar2 = pbVar7[-1];
    if (9 < (int)(char)bVar2 - 0x30U) {
      if (bVar2 == 0x2e) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_58,'.');
        jVar6 = JTOK_ERR;
        if ((end <= pbVar7) || (9 < (int)(char)*pbVar7 - 0x30U)) goto switchD_004899ab_caseD_6f;
        goto LAB_004898ac;
      }
      pbVar7 = pbVar7 + -1;
      break;
    }
  }
  goto LAB_00489aa7;
LAB_00489931:
  pbVar10 = pbVar7;
  bVar2 = *pbVar10;
  if (bVar2 < 0x20) goto switchD_004899ab_caseD_6f;
  if (bVar2 == 0x5c) {
    pbVar10 = pbVar8 + 2;
    if (end <= pbVar10) goto switchD_004899ab_caseD_6f;
    bVar2 = *pbVar10;
    if (bVar2 < 0x62) {
      if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c)) goto switchD_004899ab_caseD_6f;
    }
    else {
      switch(bVar2) {
      case 0x6e:
        bVar2 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_004899ab_caseD_6f;
      case 0x72:
        bVar2 = 0xd;
        break;
      case 0x74:
        bVar2 = 9;
        break;
      case 0x75:
        if (pbVar8 + 7 < end) {
          codepoint_ = 0;
          lVar9 = -4;
          do {
            bVar2 = pbVar8[lVar9 + 7];
            iVar4 = (int)(char)bVar2;
            uVar5 = iVar4 - 0x30;
            if (9 < uVar5) {
              if ((byte)(bVar2 + 0x9f) < 6) {
                uVar5 = iVar4 - 0x57;
              }
              else {
                if (5 < (byte)(bVar2 + 0xbf)) {
                  if (lVar9 != 0) goto switchD_004899ab_caseD_6f;
                  break;
                }
                uVar5 = iVar4 - 0x37;
              }
            }
            codepoint_ = codepoint_ * 0x10 + uVar5;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
          JSONUTF8StringFilter::push_back_u(&local_70,codepoint_);
          pbVar10 = pbVar8 + 6;
          goto LAB_00489a36;
        }
        goto switchD_004899ab_caseD_6f;
      default:
        if (bVar2 == 0x62) {
          bVar2 = 8;
        }
        else {
          if (bVar2 != 0x66) goto switchD_004899ab_caseD_6f;
          bVar2 = 0xc;
        }
      }
    }
    JSONUTF8StringFilter::push_back(&local_70,bVar2);
  }
  else {
    if (bVar2 == 0x22) {
      if ((local_70.surpair == 0 && local_70.state == 0) && ((local_70.is_valid & 1U) != 0)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (tokenVal,&local_58);
        *consumed = ((int)pbVar8 + 2) - (int)raw;
        jVar6 = JTOK_STRING;
      }
      goto switchD_004899ab_caseD_6f;
    }
    JSONUTF8StringFilter::push_back(&local_70,bVar2);
  }
LAB_00489a36:
  pbVar7 = pbVar10 + 1;
  pbVar8 = pbVar10;
  if (end <= pbVar10 + 1) goto switchD_004899ab_caseD_6f;
  goto LAB_00489931;
  while( true ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_58,*pbVar7);
    pbVar7 = pbVar7 + 1;
    if (end <= pbVar7) break;
LAB_004898ac:
    if (9 < (int)(char)*pbVar7 - 0x30U) break;
  }
LAB_00489aa7:
  if ((pbVar7 < end) && ((*pbVar7 | 0x20) == 0x65)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_58,*pbVar7);
    pbVar8 = pbVar7 + 1;
    if ((pbVar8 < end) && ((bVar2 = *pbVar8, bVar2 == 0x2d || (bVar2 == 0x2b)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_58,bVar2);
      pbVar8 = pbVar7 + 2;
    }
    jVar6 = JTOK_ERR;
    if ((pbVar8 < end) && ((int)(char)*pbVar8 - 0x30U < 10)) {
      lVar9 = (long)end - (long)pbVar8;
      do {
        pbVar7 = pbVar8;
        if (9 < (int)(char)*pbVar8 - 0x30U) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_58,*pbVar8);
        pbVar8 = pbVar8 + 1;
        lVar9 = lVar9 + -1;
        pbVar7 = (byte *)end;
      } while (lVar9 != 0);
      goto LAB_00489b55;
    }
  }
  else {
LAB_00489b55:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (tokenVal,&local_58);
    *consumed = (int)pbVar7 - (int)raw;
    jVar6 = JTOK_NUMBER;
  }
switchD_004899ab_caseD_6f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
switchD_004896b3_caseD_21:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return jVar6;
  }
  __stack_chk_fail();
}

Assistant:

enum jtokentype getJsonToken(std::string& tokenVal, unsigned int& consumed,
                            const char *raw, const char *end)
{
    tokenVal.clear();
    consumed = 0;

    const char *rawStart = raw;

    while (raw < end && (json_isspace(*raw)))          // skip whitespace
        raw++;

    if (raw >= end)
        return JTOK_NONE;

    switch (*raw) {

    case '{':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_OPEN;
    case '}':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_CLOSE;
    case '[':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_OPEN;
    case ']':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_CLOSE;

    case ':':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COLON;
    case ',':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COMMA;

    case 'n':
    case 't':
    case 'f':
        if (!strncmp(raw, "null", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_NULL;
        } else if (!strncmp(raw, "true", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_TRUE;
        } else if (!strncmp(raw, "false", 5)) {
            raw += 5;
            consumed = (raw - rawStart);
            return JTOK_KW_FALSE;
        } else
            return JTOK_ERR;

    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
        // part 1: int
        std::string numStr;

        const char *first = raw;

        const char *firstDigit = first;
        if (!json_isdigit(*firstDigit))
            firstDigit++;
        if ((*firstDigit == '0') && json_isdigit(firstDigit[1]))
            return JTOK_ERR;

        numStr += *raw;                       // copy first char
        raw++;

        if ((*first == '-') && (raw < end) && (!json_isdigit(*raw)))
            return JTOK_ERR;

        while (raw < end && json_isdigit(*raw)) {  // copy digits
            numStr += *raw;
            raw++;
        }

        // part 2: frac
        if (raw < end && *raw == '.') {
            numStr += *raw;                   // copy .
            raw++;

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        // part 3: exp
        if (raw < end && (*raw == 'e' || *raw == 'E')) {
            numStr += *raw;                   // copy E
            raw++;

            if (raw < end && (*raw == '-' || *raw == '+')) { // copy +/-
                numStr += *raw;
                raw++;
            }

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        tokenVal = numStr;
        consumed = (raw - rawStart);
        return JTOK_NUMBER;
        }

    case '"': {
        raw++;                                // skip "

        std::string valStr;
        JSONUTF8StringFilter writer(valStr);

        while (true) {
            if (raw >= end || (unsigned char)*raw < 0x20)
                return JTOK_ERR;

            else if (*raw == '\\') {
                raw++;                        // skip backslash

                if (raw >= end)
                    return JTOK_ERR;

                switch (*raw) {
                case '"':  writer.push_back('\"'); break;
                case '\\': writer.push_back('\\'); break;
                case '/':  writer.push_back('/'); break;
                case 'b':  writer.push_back('\b'); break;
                case 'f':  writer.push_back('\f'); break;
                case 'n':  writer.push_back('\n'); break;
                case 'r':  writer.push_back('\r'); break;
                case 't':  writer.push_back('\t'); break;

                case 'u': {
                    unsigned int codepoint;
                    if (raw + 1 + 4 >= end ||
                        hatoui(raw + 1, raw + 1 + 4, codepoint) !=
                               raw + 1 + 4)
                        return JTOK_ERR;
                    writer.push_back_u(codepoint);
                    raw += 4;
                    break;
                    }
                default:
                    return JTOK_ERR;

                }

                raw++;                        // skip esc'd char
            }

            else if (*raw == '"') {
                raw++;                        // skip "
                break;                        // stop scanning
            }

            else {
                writer.push_back(static_cast<unsigned char>(*raw));
                raw++;
            }
        }

        if (!writer.finalize())
            return JTOK_ERR;
        tokenVal = valStr;
        consumed = (raw - rawStart);
        return JTOK_STRING;
        }

    default:
        return JTOK_ERR;
    }
}